

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNodeSetFilter
               (xmlXPathParserContextPtr ctxt,xmlNodeSetPtr set,int filterOpIndex,int minPos,
               int maxPos,int hasNsNodes)

{
  int iVar1;
  int iVar2;
  xmlXPathContextPtr pxVar3;
  xmlDocPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlXPathStepOp *pxVar6;
  xmlNodePtr pxVar7;
  bool bVar8;
  int iVar9;
  xmlNodePtr *ppxVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint local_7c;
  int local_78;
  
  iVar9 = set->nodeNr;
  if (iVar9 != 0) {
    if (iVar9 < minPos) {
      xmlXPathNodeSetClearFromPos(set,0,hasNsNodes);
      return;
    }
    pxVar3 = ctxt->context;
    pxVar4 = pxVar3->doc;
    pxVar5 = pxVar3->node;
    iVar1 = pxVar3->contextSize;
    iVar2 = pxVar3->proximityPosition;
    pxVar6 = ctxt->comp->steps;
    pxVar3->contextSize = iVar9;
    if (set->nodeNr < 1) {
      local_7c = 0;
      uVar11 = 0;
    }
    else {
      local_78 = 1;
      uVar11 = 0;
      local_7c = 0;
      do {
        pxVar7 = set->nodeTab[(int)uVar11];
        pxVar3->node = pxVar7;
        pxVar3->proximityPosition = uVar11 + 1;
        if ((pxVar7->type != XML_NAMESPACE_DECL) && (pxVar7->doc != (_xmlDoc *)0x0)) {
          pxVar3->doc = pxVar7->doc;
        }
        iVar9 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar6 + filterOpIndex,1);
        if (ctxt->error == 0) {
          if (iVar9 < 0) {
            xmlXPathErr(ctxt,7);
            goto LAB_001e62ae;
          }
          if (((iVar9 == 0) || (local_78 < minPos)) || (maxPos < local_78)) {
            set->nodeTab[(int)uVar11] = (xmlNodePtr)0x0;
            if (pxVar7->type == XML_NAMESPACE_DECL) {
              xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar7);
            }
          }
          else {
            if (uVar11 != local_7c) {
              set->nodeTab[(int)local_7c] = pxVar7;
              set->nodeTab[(int)uVar11] = (xmlNodePtr)0x0;
            }
            local_7c = local_7c + 1;
          }
          bVar8 = true;
          if (iVar9 != 0) {
            if (local_78 == maxPos) {
              bVar8 = false;
              uVar11 = uVar11 + 1;
            }
            else {
              local_78 = local_78 + 1;
            }
          }
        }
        else {
LAB_001e62ae:
          bVar8 = false;
        }
      } while ((bVar8) && (uVar11 = uVar11 + 1, (int)uVar11 < set->nodeNr));
    }
    if ((hasNsNodes != 0) && ((int)uVar11 < set->nodeNr)) {
      lVar12 = (long)(int)uVar11;
      do {
        pxVar7 = set->nodeTab[lVar12];
        if ((pxVar7 != (xmlNodePtr)0x0) && (pxVar7->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar7);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < set->nodeNr);
    }
    set->nodeNr = local_7c;
    if ((int)local_7c < (int)((uint)set->nodeMax >> 1) && 10 < set->nodeMax) {
      uVar13 = 10;
      if (10 < (int)local_7c) {
        uVar13 = (ulong)local_7c;
      }
      ppxVar10 = (xmlNodePtr *)(*xmlRealloc)(set->nodeTab,uVar13 * 8);
      if (ppxVar10 == (xmlNodePtr *)0x0) {
        ctxt->error = 0xf;
        xmlXPathErrMemory(ctxt->context,"shrinking nodeset\n");
      }
      else {
        set->nodeTab = ppxVar10;
        set->nodeMax = (int)uVar13;
      }
    }
    pxVar3->node = pxVar5;
    pxVar3->doc = pxVar4;
    pxVar3->contextSize = iVar1;
    pxVar3->proximityPosition = iVar2;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetFilter(xmlXPathParserContextPtr ctxt,
		      xmlNodeSetPtr set,
		      int filterOpIndex,
                      int minPos, int maxPos,
		      int hasNsNodes)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((set == NULL) || (set->nodeNr == 0))
        return;

    /*
    * Check if the node set contains a sufficient number of nodes for
    * the requested range.
    */
    if (set->nodeNr < minPos) {
        xmlXPathNodeSetClear(set, hasNsNodes);
        return;
    }

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = set->nodeNr;

    for (i = 0, j = 0, pos = 1; i < set->nodeNr; i++) {
        xmlNodePtr node = set->nodeTab[i];
        int res;

        xpctxt->node = node;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((node->type != XML_NAMESPACE_DECL) &&
            (node->doc != NULL))
            xpctxt->doc = node->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                set->nodeTab[j] = node;
                set->nodeTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial node set. */
            set->nodeTab[i] = NULL;
            if (node->type == XML_NAMESPACE_DECL)
                xmlXPathNodeSetFreeNs((xmlNsPtr) node);
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    if (hasNsNodes) {
        for (; i < set->nodeNr; i++) {
            xmlNodePtr node = set->nodeTab[i];
            if ((node != NULL) && (node->type == XML_NAMESPACE_DECL))
                xmlXPathNodeSetFreeNs((xmlNsPtr) node);
        }
    }

    set->nodeNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((set->nodeMax > XML_NODESET_DEFAULT) &&
        (set->nodeNr < set->nodeMax / 2)) {
        xmlNodePtr *tmp;
        int nodeMax = set->nodeNr;

        if (nodeMax < XML_NODESET_DEFAULT)
            nodeMax = XML_NODESET_DEFAULT;
        tmp = (xmlNodePtr *) xmlRealloc(set->nodeTab,
                nodeMax * sizeof(xmlNodePtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking nodeset\n");
        } else {
            set->nodeTab = tmp;
            set->nodeMax = nodeMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}